

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O3

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext *ctx,ExprSwitch *node)

{
  ExpressionContext *pEVar1;
  LoopInfo *pLVar2;
  ulong uVar3;
  long lVar4;
  char *__function;
  uint uVar5;
  TypeBase *type;
  ExprBase *pEVar6;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> caseBlocks;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> conditionBlocks;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> local_160;
  SmallArray<LLVMBasicBlockRefOpaque_*,_16U> local_c8;
  
  CompileLlvm(ctx,node->condition);
  local_160.allocator = ctx->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_160.data = local_160.little;
  local_160.count = 0;
  local_160.max = 0x10;
  pEVar6 = (node->cases).head;
  local_c8.allocator = local_160.allocator;
  if (pEVar6 != (ExprBase *)0x0) {
    do {
      if (local_c8.count == local_c8.max) {
        SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::grow(&local_c8,local_c8.count);
      }
      if (local_c8.data == (LLVMBasicBlockRefOpaque **)0x0) goto LAB_00181a6e;
      uVar3 = (ulong)local_c8.count;
      local_c8.count = local_c8.count + 1;
      local_c8.data[uVar3] = (LLVMBasicBlockRefOpaque *)&placeholderBasicBlock;
      pEVar6 = pEVar6->next;
    } while (pEVar6 != (ExprBase *)0x0);
  }
  pEVar6 = (node->blocks).head;
  if (pEVar6 != (ExprBase *)0x0) {
    do {
      if (local_160.count == local_160.max) {
        SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::grow(&local_160,local_160.count);
      }
      if (local_160.data == (LLVMBasicBlockRefOpaque **)0x0) goto LAB_00181a6e;
      uVar3 = (ulong)local_160.count;
      local_160.count = local_160.count + 1;
      local_160.data[uVar3] = (LLVMBasicBlockRefOpaque *)&placeholderBasicBlock;
      pEVar6 = pEVar6->next;
    } while (pEVar6 != (ExprBase *)0x0);
  }
  pEVar6 = (node->cases).head;
  if (pEVar6 == (ExprBase *)0x0) {
LAB_00181970:
    uVar5 = (ctx->loopInfo).count;
    if (uVar5 == (ctx->loopInfo).max) {
      SmallArray<LlvmCompilationContext::LoopInfo,_32U>::grow(&ctx->loopInfo,uVar5);
    }
    pLVar2 = (ctx->loopInfo).data;
    if (pLVar2 == (LoopInfo *)0x0) {
      __function = 
      "void SmallArray<LlvmCompilationContext::LoopInfo, 32>::push_back(const T &) [T = LlvmCompilationContext::LoopInfo, N = 32]"
      ;
      goto LAB_00181a83;
    }
    uVar5 = (ctx->loopInfo).count;
    (ctx->loopInfo).count = uVar5 + 1;
    pLVar2[uVar5].breakBlock = (LLVMBasicBlockRef)&placeholderBasicBlock;
    pLVar2[uVar5].continueBlock = (LLVMBasicBlockRef)0x0;
    pEVar6 = (node->blocks).head;
    if (pEVar6 == (ExprBase *)0x0) {
LAB_00181a0c:
      if (node->defaultBlock != (ExprBase *)0x0) {
        CompileLlvm(ctx,node->defaultBlock);
      }
      uVar5 = (ctx->loopInfo).count;
      if (uVar5 == 0) {
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x183,
                      "void SmallArray<LlvmCompilationContext::LoopInfo, 32>::pop_back() [T = LlvmCompilationContext::LoopInfo, N = 32]"
                     );
      }
      (ctx->loopInfo).count = uVar5 - 1;
      if ((node->super_ExprBase).type != ctx->ctx->typeVoid) {
        __assert_fail("node->type == ctx.ctx.typeVoid",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                      ,0x27b,
                      "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
      }
      SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&local_160);
      SmallArray<LLVMBasicBlockRefOpaque_*,_16U>::~SmallArray(&local_c8);
      return (LLVMValueRef)0x0;
    }
    uVar5 = 0;
    do {
      if (local_160.count <= uVar5) break;
      CompileLlvm(ctx,pEVar6);
      pEVar6 = pEVar6->next;
      if (pEVar6 == (ExprBase *)0x0) goto LAB_00181a0c;
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_160.count);
  }
  else {
    uVar5 = 0;
    do {
      if (local_c8.count <= uVar5) break;
      CompileLlvm(ctx,pEVar6);
      type = pEVar6->type;
      pEVar1 = ctx->ctx;
      lVar4 = 0x89d8;
      if (((pEVar1->typeBool == type) || (pEVar1->typeChar == type)) || (pEVar1->typeShort == type))
      {
LAB_00181944:
        type = *(TypeBase **)((long)(pEVar1->uniqueDependencies).little + lVar4 + -0x30);
      }
      else if (pEVar1->typeFloat == type) {
        lVar4 = 0x89f0;
        goto LAB_00181944;
      }
      CompileLlvmType(ctx,type);
      if (local_160.count <= uVar5) break;
      pEVar6 = pEVar6->next;
      if (pEVar6 == (ExprBase *)0x0) goto LAB_00181970;
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_c8.count);
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<LLVMBasicBlockRefOpaque *, 16>::operator[](unsigned int) [T = LLVMBasicBlockRefOpaque *, N = 16]"
               );
LAB_00181a6e:
  __function = 
  "void SmallArray<LLVMBasicBlockRefOpaque *, 16>::push_back(const T &) [T = LLVMBasicBlockRefOpaque *, N = 16]"
  ;
LAB_00181a83:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

LLVMValueRef CompileLlvmSwitch(LlvmCompilationContext &ctx, ExprSwitch *node)
{
	CompileLlvm(ctx, node->condition);

	SmallArray<LLVMBasicBlockRef, 16> conditionBlocks(ctx.allocator);
	SmallArray<LLVMBasicBlockRef, 16> caseBlocks(ctx.allocator);

	// Generate blocks for all cases
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next)
		conditionBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_case"));

	// Generate blocks for all cases
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next)
		caseBlocks.push_back(LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "case_block"));

	LLVMBasicBlockRef defaultBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "default_block");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "switch_exit");

	LLVMBuildBr(ctx.builder, conditionBlocks.empty() ? defaultBlock : conditionBlocks[0]);

	unsigned i;

	// Generate code for all conditions
	i = 0;
	for(ExprBase *curr = node->cases.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, conditionBlocks[i]);

		LLVMValueRef condition = CompileLlvm(ctx, curr);

		condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, curr->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, condition, caseBlocks[i], curr->next ? conditionBlocks[i + 1] : defaultBlock);
	}

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, NULL));

	// Generate code for all cases
	i = 0;
	for(ExprBase *curr = node->blocks.head; curr; curr = curr->next, i++)
	{
		LLVMPositionBuilderAtEnd(ctx.builder, caseBlocks[i]);

		CompileLlvm(ctx, curr);

		LLVMBuildBr(ctx.builder, curr->next ? caseBlocks[i + 1] : defaultBlock);
	}

	// Create default block
	LLVMPositionBuilderAtEnd(ctx.builder, defaultBlock);

	if(node->defaultBlock)
		CompileLlvm(ctx, node->defaultBlock);

	LLVMBuildBr(ctx.builder, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}